

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_record.cpp
# Opt level: O0

long data_cb_record(cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,
                   long nframes)

{
  long in_RCX;
  long in_RDX;
  __atomic_base<int> *in_RSI;
  long in_RDI;
  long in_R8;
  long i;
  float *b;
  user_state_record *u;
  long local_48;
  long local_8;
  
  if (((in_RDI == 0) || (in_RDX == 0)) || (in_RCX != 0)) {
    local_8 = -1;
  }
  else {
    for (local_48 = 0; local_8 = in_R8, local_48 < in_R8; local_48 = local_48 + 1) {
      if ((*(float *)(in_RDX + local_48 * 4) <= -1.0) || (1.0 <= *(float *)(in_RDX + local_48 * 4)))
      {
        std::__atomic_base<int>::operator=(in_RSI,(__int_type)((ulong)in_RDX >> 0x20));
        return in_R8;
      }
    }
  }
  return local_8;
}

Assistant:

long data_cb_record(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_record * u = reinterpret_cast<user_state_record*>(user);
  float *b = (float *)inputbuffer;

  if (stream == NULL  || inputbuffer == NULL || outputbuffer != NULL) {
    return CUBEB_ERROR;
  }

  for (long i = 0; i < nframes; i++) {
    if (b[i] <= -1.0 || b[i] >= 1.0) {
      u->invalid_audio_value = 1;
      break;
    }
  }

  return nframes;
}